

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool gl4cts::Utils::isGLVersionAtLeast(Functions *gl,GLint required_major,GLint required_minor)

{
  GLenum err;
  GLint local_28;
  GLint local_24;
  GLint minor;
  GLint major;
  GLint required_minor_local;
  GLint required_major_local;
  Functions *gl_local;
  
  local_24 = 0;
  local_28 = 0;
  minor = required_minor;
  major = required_major;
  _required_minor_local = gl;
  (*gl->getIntegerv)(0x821b,&local_24);
  (*_required_minor_local->getIntegerv)(0x821c,&local_28);
  err = (*_required_minor_local->getError)();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x5c9);
  if (major < local_24) {
    gl_local._7_1_ = true;
  }
  else if (local_24 == major) {
    if (local_28 < minor) {
      gl_local._7_1_ = false;
    }
    else {
      gl_local._7_1_ = true;
    }
  }
  else {
    gl_local._7_1_ = false;
  }
  return gl_local._7_1_;
}

Assistant:

bool Utils::isGLVersionAtLeast(const glw::Functions& gl, glw::GLint required_major, glw::GLint required_minor)
{
	glw::GLint major = 0;
	glw::GLint minor = 0;

	gl.getIntegerv(GL_MAJOR_VERSION, &major);
	gl.getIntegerv(GL_MINOR_VERSION, &minor);

	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	if (major > required_major)
	{
		/* Major is higher than required one */
		return true;
	}
	else if (major == required_major)
	{
		if (minor >= required_minor)
		{
			/* Major is equal to required one */
			/* Minor is higher than or equal to required one */
			return true;
		}
		else
		{
			/* Major is equal to required one */
			/* Minor is lower than required one */
			return false;
		}
	}
	else
	{
		/* Major is lower than required one */
		return false;
	}
}